

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_add(curl_hash *h,void *key,size_t key_len,void *p)

{
  size_t sVar1;
  curl_llist *pcVar2;
  curl_hash_element *ne;
  curl_llist *l;
  curl_llist_element *le;
  curl_hash_element *he;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  curl_hash *h_local;
  
  pcVar2 = h->table;
  sVar1 = (*h->hash_func)(key,key_len,(long)h->slots);
  pcVar2 = pcVar2 + sVar1;
  l = (curl_llist *)pcVar2->head;
  do {
    if (l == (curl_llist *)0x0) {
LAB_00a6a9c7:
      ne = mk_hash_element(key,key_len,p);
      if (ne == (curl_hash_element *)0x0) {
        h_local = (curl_hash *)0x0;
      }
      else {
        Curl_llist_insert_next(pcVar2,pcVar2->tail,ne,&ne->list);
        h->size = h->size + 1;
        h_local = (curl_hash *)p;
      }
      return h_local;
    }
    sVar1 = (*h->comp_func)(&l->head[1].next,(size_t)l->head[1].prev,key,key_len);
    if (sVar1 != 0) {
      Curl_llist_remove(pcVar2,(curl_llist_element *)l,h);
      h->size = h->size - 1;
      goto LAB_00a6a9c7;
    }
    l = (curl_llist *)l->dtor;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct curl_hash *h, void *key, size_t key_len, void *p)
{
  struct curl_hash_element  *he;
  struct curl_llist_element *le;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    Curl_llist_insert_next(l, l->tail, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}